

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int query_pattr(attr_list list,atom_t attr_id,attr_value_type *val_type_p,attr_union *value_p)

{
  int iVar1;
  attr_value_type *in_RCX;
  long lVar2;
  undefined4 *in_RDX;
  int in_ESI;
  short *in_RDI;
  int index;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI != (short *)0x0) {
    if (*in_RDI == 0) {
      for (iVar3 = 0; iVar3 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 1); iVar3 = iVar3 + 1) {
        if (*(int *)(*(long *)(in_RDI + 8) + 4 + (long)iVar3 * 8) == in_ESI) {
          if (in_RDX != (undefined4 *)0x0) {
            *in_RDX = 1;
          }
          if (in_RCX != (attr_value_type *)0x0) {
            *in_RCX = *(attr_value_type *)(*(long *)(in_RDI + 8) + 8 + (long)iVar3 * 8);
          }
          return 1;
        }
      }
      for (iVar3 = 0; iVar3 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 2); iVar3 = iVar3 + 1) {
        if (*(int *)(*(long *)(in_RDI + 4) + (long)iVar3 * 0x18) == in_ESI) {
          if (in_RDX != (undefined4 *)0x0) {
            *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 4) + (long)iVar3 * 0x18 + 4);
          }
          if (in_RCX != (attr_value_type *)0x0) {
            lVar2 = *(long *)(in_RDI + 4) + (long)iVar3 * 0x18;
            *(undefined8 *)in_RCX = *(undefined8 *)(lVar2 + 8);
            *(undefined8 *)(in_RCX + 2) = *(undefined8 *)(lVar2 + 0x10);
          }
          return 1;
        }
      }
    }
    else {
      for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 4); iVar3 = iVar3 + 1) {
        iVar1 = query_pattr((attr_list)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (atom_t)((ulong)in_RDX >> 0x20),in_RCX,
                            (attr_union *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

extern int
query_pattr(attr_list list, atom_t attr_id, attr_value_type *val_type_p, attr_union *value_p)
{
    if (list == NULL) return 0;
    if (list->list_of_lists) {
        int i;
        for (i=0; i< list->l.lists.sublist_count; i++) {
            if (query_pattr(list->l.lists.lists[i], attr_id, val_type_p,
                           value_p)) {
                return 1;
            }
        }
        return 0;
    } else {
	int index = 0;
	while(index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = Attr_Int4;
		}
		if (value_p != NULL) {
		    if (sizeof(long) != 4){
			value_p->u.i = (int)(long)list->l.list.iattrs->iattr[index].value;
		    } else {
			value_p->u.l = list->l.list.iattrs->iattr[index].value;
		    }
		}
		return 1;
	    }
	    index++;
        }
	index = 0;
	while(index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = list->l.list.attributes[index].val_type;
		}
		if (value_p != NULL) {
		    *value_p = list->l.list.attributes[index].value;
		}
		return 1;
	    }
	    index++;
        }
        return 0;
    }
}